

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v5.cpp
# Opt level: O2

error_handler_result __thiscall
error_reporter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::x3::expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::spirit::x3::context<error_counter_tag,_std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>_>
::operator()(error_reporter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::x3::expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::spirit::x3::context<error_counter_tag,_std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>_>
             *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *first,
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *last,expectation_failure<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *x,context<error_counter_tag,_std::reference_wrapper<error_counter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::spirit::x3::context<boost::spirit::x3::skipper_tag,_const_boost::spirit::x3::char_class<boost::spirit::char_encoding::ascii,_boost::spirit::x3::space_tag>,_boost::spirit::x3::unused_type>_>
                     *context)

{
  char *pcVar1;
  ostream *poVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"ERROR! : ");
  pcVar3 = (char *)(**(code **)(*(long *)x + 0x10))(x);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::string((string *)&local_50,(string *)&x->which_);
  std::operator+(&local_90,"Error! Expecting: ",&local_50);
  std::operator+(&message,&local_90," here:");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&message);
  std::operator<<(poVar2,"\n");
  pcVar3 = first->_M_current;
  pcVar1 = (x->where_)._M_current;
  iVar4 = (int)pcVar1 - (int)pcVar3;
  for (; pcVar3 != pcVar1; pcVar3 = pcVar3 + 1) {
    std::operator<<((ostream *)&std::cout,*pcVar3);
  }
  for (uVar5 = 0; ((uint)uVar5 < 10 && (pcVar1 + uVar5 != last->_M_current)); uVar5 = uVar5 + 1) {
    std::operator<<((ostream *)&std::cout,pcVar1[uVar5]);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  for (; 0 < iVar4; iVar4 = iVar4 + -1) {
    std::operator<<((ostream *)&std::cout,'-');
  }
  std::operator<<((ostream *)&std::cout,"^");
  for (; 1 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
    std::operator<<((ostream *)&std::cout,'-');
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::__cxx11::string::~string((string *)&message);
  return fail;
}

Assistant:

x3::error_handler_result operator() (
      Iterator const& first, Iterator const& last, Exception const& x,
      Context const& context) {

      std::cout << "ERROR! : " << x.what() << "\n";
      std::string message = "Error! Expecting: " + x.which() + " here:";
      std::cout << message << "\n";

      auto curr = first;
      auto iter = x.where();

      int prefix_size = 0;
      while ( curr != iter ) {
         std::cout << *curr;
         ++prefix_size;
         ++curr;
      }

      int char_count = 0;
      for (;char_count < 10; ++char_count) {
         if (iter == last) break;
         std::cout << *iter;
         ++iter;
      }
      std::cout << "\n";
      for (; prefix_size > 0; --prefix_size) {
         std::cout << '-';
      }

      std::cout << "^";
      for (; char_count > 1; --char_count){
         std::cout << '-';
      }
      std::cout << "\n";

      return x3::error_handler_result::fail;


   }